

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-dump.cpp
# Opt level: O0

void dump_graph(CDGraph *graph)

{
  CDNode *this;
  bool bVar1;
  uint uVar2;
  reference ppCVar3;
  string *psVar4;
  ostream *poVar5;
  CDGraph *in_RDI;
  CDNode *succ;
  const_iterator __end2;
  const_iterator __begin2;
  EdgesT *__range2;
  ContainedType *nd_1;
  node_iterator __end1_1;
  node_iterator __begin1_1;
  CDGraph *__range1_1;
  ContainedType *nd;
  node_iterator __end1;
  node_iterator __begin1;
  CDGraph *__range1;
  ostream *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
  local_58;
  EdgesT *local_50;
  ContainedType *local_48;
  iterator local_40;
  iterator local_38;
  CDGraph *local_30;
  ContainedType *local_28;
  iterator local_20;
  iterator local_18 [2];
  CDGraph *local_8;
  
  local_8 = in_RDI;
  local_18[0]._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       dg::CDGraph::begin((CDGraph *)in_stack_ffffffffffffff58);
  local_20._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       dg::CDGraph::end((CDGraph *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_28 = dg::CDGraph::node_iterator::operator*((node_iterator *)0x159c84);
    poVar5 = std::operator<<((ostream *)&std::cout," ");
    psVar4 = dg::CDGraph::getName_abi_cxx11_(local_8);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,"_");
    uVar2 = dg::CDNode::getID(local_28);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    poVar5 = std::operator<<(poVar5," [label=\"");
    psVar4 = dg::CDGraph::getName_abi_cxx11_(local_8);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,":");
    uVar2 = dg::CDNode::getID(local_28);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    std::operator<<(poVar5,"\"");
    bVar1 = dg::CDGraph::isPredicate
                      ((CDGraph *)in_stack_ffffffffffffff60,(CDNode *)in_stack_ffffffffffffff58);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," color=blue");
    }
    std::operator<<((ostream *)&std::cout,"]\n");
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
    ::operator++(local_18);
  }
  local_30 = local_8;
  local_38._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       dg::CDGraph::begin((CDGraph *)in_stack_ffffffffffffff58);
  local_40._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       dg::CDGraph::end((CDGraph *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_48 = dg::CDGraph::node_iterator::operator*((node_iterator *)0x159df5);
    local_50 = dg::ElemWithEdges<dg::CDNode>::successors((ElemWithEdges<dg::CDNode> *)local_48);
    local_58._M_current =
         (CDNode **)
         std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::begin
                   ((vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)in_stack_ffffffffffffff58
                   );
    std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::end
              ((vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      ppCVar3 = __gnu_cxx::
                __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                ::operator*(&local_58);
      this = *ppCVar3;
      in_stack_ffffffffffffff58 = std::operator<<((ostream *)&std::cout," ");
      psVar4 = dg::CDGraph::getName_abi_cxx11_(local_8);
      poVar5 = std::operator<<(in_stack_ffffffffffffff58,(string *)psVar4);
      in_stack_ffffffffffffff60 = std::operator<<(poVar5,"_");
      uVar2 = dg::CDNode::getID(local_48);
      poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff60,uVar2);
      poVar5 = std::operator<<(poVar5," -> ");
      psVar4 = dg::CDGraph::getName_abi_cxx11_(local_8);
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      poVar5 = std::operator<<(poVar5,"_");
      uVar2 = dg::CDNode::getID(this);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::operator<<(poVar5,"\n");
      __gnu_cxx::
      __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
      ::operator++(&local_58);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

static void dump_graph(CDGraph *graph) {
    assert(graph);
    // dump nodes
    for (const auto *nd : *graph) {
        std::cout << " " << graph->getName() << "_" << nd->getID()
                  << " [label=\"" << graph->getName() << ":" << nd->getID()
                  << "\"";
        if (graph->isPredicate(*nd)) {
            std::cout << " color=blue";
        }
        std::cout << "]\n";
    }

    // dump edges
    for (const auto *nd : *graph) {
        for (const auto *succ : nd->successors()) {
            std::cout << " " << graph->getName() << "_" << nd->getID() << " -> "
                      << graph->getName() << "_" << succ->getID() << "\n";
        }
    }
}